

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall google::protobuf::internal::MapFieldBase::~MapFieldBase(MapFieldBase *this)

{
  Arena **v1;
  void **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  ReflectionPayload *this_00;
  LogMessage local_40;
  Voidify local_29;
  void *local_28;
  Arena *local_20;
  Nullable<const_char_*> local_18;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  MapFieldBase *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)this;
  local_20 = arena(this);
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Arena*>(&local_20);
  local_28 = (void *)0x0;
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_28);
  local_18 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::Arena*,decltype(nullptr)>(v1,v2,"arena() == nullptr");
  if (local_18 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_18);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.cc"
               ,0x22,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  this_00 = maybe_payload(this);
  if (this_00 != (ReflectionPayload *)0x0) {
    ReflectionPayload::~ReflectionPayload(this_00);
    operator_delete(this_00,0x28);
  }
  return;
}

Assistant:

MapFieldBase::~MapFieldBase() {
  ABSL_DCHECK_EQ(arena(), nullptr);
  delete maybe_payload();
}